

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,string *base_expr
          ,SPIRType *type)

{
  SmallVector<unsigned_int,_8UL> *this_00;
  int iVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  char cVar8;
  bool bVar9;
  uint32_t uVar10;
  SPIRType *pSVar11;
  uint uVar12;
  ulong uVar13;
  SmallVector<unsigned_int,_8UL> *pSVar14;
  uint __val;
  bool bVar15;
  string *expr;
  string __str;
  string subexpr;
  string local_200;
  SPIRType *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  SPIRType *local_1d0;
  string *local_1c8;
  string local_1c0;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 local_180 [192];
  SmallVector<unsigned_int,_8UL> local_c0;
  ulong local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  iVar1 = *(int *)&(type->super_IVariant).field_0xc;
  bVar15 = false;
  if (iVar1 == 2 && *(int *)&(parent_type->super_IVariant).field_0xc == 0xf) {
    bVar15 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  local_180._0_8_ = &PTR__SPIRType_003f9270;
  local_180._8_4_ = 0;
  local_180._12_4_ = Unknown;
  local_180._16_4_ = 0;
  local_180._20_4_ = 1;
  local_180._24_4_ = 1;
  this_00 = (SmallVector<unsigned_int,_8UL> *)(local_180 + 0x20);
  local_180._32_8_ = local_180 + 0x38;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_8_ = local_180._120_8_ & 0xffff000000000000;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_88 = local_88 & 0xffffffff00000000;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pSVar14 = this_00;
  local_1d0 = parent_type;
  local_1c8 = base_expr;
  if (bVar15) {
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
    local_180._8_4_ = (pSVar11->super_IVariant).self.id;
    uVar2 = *(undefined8 *)&(pSVar11->super_IVariant).field_0xc;
    uVar3 = pSVar11->vecsize;
    uVar4 = pSVar11->columns;
    local_180._12_4_ = (undefined4)uVar2;
    local_180._16_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    local_180._20_4_ = uVar3;
    local_180._24_4_ = uVar4;
    SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar11->array);
    SmallVector<bool,_8UL>::operator=
              ((SmallVector<bool,_8UL> *)(local_180 + 0x58),&pSVar11->array_size_literal);
    local_180._120_4_ = pSVar11->pointer_depth;
    local_180[0x7c] = pSVar11->pointer;
    local_180[0x7d] = pSVar11->forward_pointer;
    local_180._126_2_ = *(undefined2 *)&pSVar11->field_0x7e;
    local_180._128_4_ = pSVar11->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_180 + 0x88),
               &pSVar11->member_types);
    SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar11->member_type_index_redirection);
    local_88._0_4_ = (pSVar11->image).type;
    local_88._4_4_ = (pSVar11->image).dim;
    uStack_80._0_1_ = (pSVar11->image).depth;
    uStack_80._1_1_ = (pSVar11->image).arrayed;
    uStack_80._2_1_ = (pSVar11->image).ms;
    uStack_80._3_1_ = (pSVar11->image).field_0xb;
    uStack_80._4_4_ = (pSVar11->image).sampled;
    local_78._0_4_ = (pSVar11->image).format;
    local_78._4_4_ = (pSVar11->image).access;
    uStack_70._0_4_ = (pSVar11->type_alias).id;
    uStack_70._4_4_ = (pSVar11->parent_type).id;
    if (pSVar11 != (SPIRType *)local_180) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&(pSVar11->member_name_cache)._M_h);
    }
    local_180._12_4_ = (this->backend).boolean_in_struct_remapped_type;
    bVar15 = true;
  }
  else {
    bVar15 = false;
    if ((iVar1 == 2) && ((this->backend).boolean_in_struct_remapped_type != Boolean)) {
      pSVar11 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (type->parent_type).id);
      local_180._8_4_ = (pSVar11->super_IVariant).self.id;
      uVar2 = *(undefined8 *)&(pSVar11->super_IVariant).field_0xc;
      uVar5 = pSVar11->vecsize;
      uVar6 = pSVar11->columns;
      local_180._12_4_ = (undefined4)uVar2;
      local_180._16_4_ = (undefined4)((ulong)uVar2 >> 0x20);
      local_180._20_4_ = uVar5;
      local_180._24_4_ = uVar6;
      SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar11->array);
      SmallVector<bool,_8UL>::operator=
                ((SmallVector<bool,_8UL> *)(local_180 + 0x58),&pSVar11->array_size_literal);
      local_180._120_4_ = pSVar11->pointer_depth;
      local_180[0x7c] = pSVar11->pointer;
      local_180[0x7d] = pSVar11->forward_pointer;
      local_180._126_2_ = *(undefined2 *)&pSVar11->field_0x7e;
      local_180._128_4_ = pSVar11->storage;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_180 + 0x88)
                 ,&pSVar11->member_types);
      SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar11->member_type_index_redirection);
      local_88._0_4_ = (pSVar11->image).type;
      local_88._4_4_ = (pSVar11->image).dim;
      uStack_80._0_1_ = (pSVar11->image).depth;
      uStack_80._1_1_ = (pSVar11->image).arrayed;
      uStack_80._2_1_ = (pSVar11->image).ms;
      uStack_80._3_1_ = (pSVar11->image).field_0xb;
      uStack_80._4_4_ = (pSVar11->image).sampled;
      local_78._0_4_ = (pSVar11->image).format;
      local_78._4_4_ = (pSVar11->image).access;
      uStack_70._0_4_ = (pSVar11->type_alias).id;
      uStack_70._4_4_ = (pSVar11->parent_type).id;
      bVar15 = true;
      if (pSVar11 != (SPIRType *)local_180) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,&(pSVar11->member_name_cache)._M_h);
      }
    }
  }
  uVar10 = to_array_size_literal
                     (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
  local_1e0 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
  local_1d8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
  if (uVar10 != 0) {
    __val = 0;
    do {
      cVar8 = '\x01';
      if (9 < __val) {
        uVar13 = (ulong)__val;
        cVar7 = '\x04';
        do {
          cVar8 = cVar7;
          uVar12 = (uint)uVar13;
          if (uVar12 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_001f1549;
          }
          if (uVar12 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_001f1549;
          }
          if (uVar12 < 10000) goto LAB_001f1549;
          uVar13 = uVar13 / 10000;
          cVar7 = cVar8 + '\x04';
        } while (99999 < uVar12);
        cVar8 = cVar8 + '\x01';
      }
LAB_001f1549:
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_200,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_200._M_dataplus._M_p,(uint)local_200._M_string_length,__val);
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_1c0,(spirv_cross *)local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x366551,
                 (char (*) [2])&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x366456,
                 (char (*) [2])pSVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      bVar9 = Compiler::type_is_top_level_array(&this->super_Compiler,local_1e0);
      if (bVar9) {
        to_rerolled_array_expression(&local_200,this,local_1d0,&local_1c0,local_1e0);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
      }
      else {
        if (bVar15) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])((spirv_cross *)local_1a0,this,local_180,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&local_200,(spirv_cross *)local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x379f10,
                     (char (*) [2])&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3623fe,
                     (char (*) [2])pSVar14);
          ::std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_200);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          if (local_1a0[0] != local_190) {
            operator_delete(local_1a0[0]);
          }
        }
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1c0._M_dataplus._M_p);
      }
      __val = __val + 1;
      if (__val < uVar10) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
    } while (__val != uVar10);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_180._0_8_ = &PTR__SPIRType_003f9270;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type;
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!type_is_top_level_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}